

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRConstantOp * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::allocate<spirv_cross::SPIRConstantOp&>
          (ObjectPool<spirv_cross::SPIRConstantOp> *this,SPIRConstantOp *p)

{
  Vector<spirv_cross::SPIRConstantOp_*> *this_00;
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRConstantOp_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
  _Var2;
  _Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false> _Var3;
  ulong count;
  SPIRConstantOp *pSVar4;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>)malloc(count * 0x50);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl !=
        (SPIRConstantOp *)0x0) {
      SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::reserve(this_00,count);
      _Var3._M_head_impl =
           (SPIRConstantOp *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.
                           buffer_size + 1);
        sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.ptr[sVar1] =
             _Var3._M_head_impl;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size = sVar1 + 1;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRConstantOp_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl !=
          (SPIRConstantOp *)0x0) goto LAB_002a3734;
    }
    pSVar4 = (SPIRConstantOp *)0x0;
  }
  else {
LAB_002a3734:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
    pSVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::resize(this_00,sVar1 - 1);
    }
    (pSVar4->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_00360178;
    (pSVar4->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar4->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstantOp_00361a08;
    *(undefined4 *)&(pSVar4->super_IVariant).field_0xc =
         *(undefined4 *)&(p->super_IVariant).field_0xc;
    (pSVar4->arguments).super_VectorView<unsigned_int>.ptr = (uint *)0x0;
    (pSVar4->arguments).super_VectorView<unsigned_int>.buffer_size = 0;
    (pSVar4->arguments).super_VectorView<unsigned_int>.ptr =
         (uint *)&(pSVar4->arguments).stack_storage;
    (pSVar4->arguments).buffer_capacity = 8;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar4->arguments,&p->arguments);
    (pSVar4->basetype).id = (p->basetype).id;
  }
  return pSVar4;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}